

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O2

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::run(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
      *this,double maxDuration,bool resetPopulation)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  Logger *this_00;
  undefined7 in_register_00000031;
  double local_30;
  
  if ((int)CONCAT71(in_register_00000031,resetPopulation) != 0) {
    reset(this);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Time");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Fitness");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_30 = 0.0;
  lVar2 = std::chrono::_V2::system_clock::now();
  do {
    if ((this->_population)._chromosomes.
        super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(this->_population)._fittestChromosomeIndex].
        _fitness <= this->_minFitness) goto LAB_00104abe;
    lVar3 = std::chrono::_V2::system_clock::now();
    local_30 = (double)(lVar3 - lVar2) / 1000000000.0;
    poVar1 = std::ostream::_M_insert<double>(local_30);
    poVar1 = std::operator<<(poVar1,"\t");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(this->_population)._chromosomes.
                               super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(this->_population)._fittestChromosomeIndex]._fitness);
    std::endl<char,std::char_traits<char>>(poVar1);
    step(this,(float)local_30);
  } while (local_30 < maxDuration);
  this_00 = getLogger();
  Logger::warning<char[21]>
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/rafagaitan[P]crsga/include/crsGA/GeneticAlgorithm.hpp"
             ,0xb4,(char (*) [21])"Max duration reached");
LAB_00104abe:
  poVar1 = std::ostream::_M_insert<double>(local_30);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->_population)._chromosomes.
                             super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                             ._M_impl.super__Vector_impl_data._M_start
                             [(this->_population)._fittestChromosomeIndex]._fitness);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Best:");
  poVar1 = operator<<(poVar1,(this->_population)._chromosomes.
                             super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                             (this->_population)._fittestChromosomeIndex);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void run(double maxDuration, bool resetPopulation = false)
    {
        if (resetPopulation)
            reset();
        std::cout << "Time"
                  << "\t"
                  << "Fitness" << std::endl;
        std::chrono::high_resolution_clock::time_point t1 = std::chrono::high_resolution_clock::now();
        auto simulationTime = std::chrono::duration_cast<std::chrono::duration<double>>(t1 - t1).count();
        while (!isSolution(_population.getFittestChromosome()))
        {
            std::chrono::high_resolution_clock::time_point t2 = std::chrono::high_resolution_clock::now();
            simulationTime = std::chrono::duration_cast<std::chrono::duration<double>>(t2 - t1).count();
            std::cout << simulationTime << "\t" << _population.getFittestChromosome().getFitness() << std::endl;
            step(simulationTime);
            if (simulationTime >= maxDuration)
            {
                LOG_WARNING("Max duration reached");
                break;
            }
        }
        std::cout << simulationTime << "\t" << _population.getFittestChromosome().getFitness() << std::endl;
        std::cout << "Best:" << _population.getFittestChromosome() << std::endl;
    }